

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::VectorListBuffer::VectorListBuffer
          (VectorListBuffer *this,LogicalType *list_type,idx_t initial_capacity)

{
  LogicalType *args;
  idx_t initial_capacity_local;
  
  initial_capacity_local = initial_capacity;
  VectorBuffer::VectorBuffer(&this->super_VectorBuffer,LIST_BUFFER);
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorListBuffer_01775a10;
  args = ListType::GetChildType(list_type);
  make_uniq<duckdb::Vector,duckdb::LogicalType_const&,unsigned_long&>
            ((duckdb *)&this->child,args,&initial_capacity_local);
  this->capacity = initial_capacity_local;
  this->size = 0;
  return;
}

Assistant:

VectorListBuffer::VectorListBuffer(const LogicalType &list_type, idx_t initial_capacity)
    : VectorBuffer(VectorBufferType::LIST_BUFFER),
      child(make_uniq<Vector>(ListType::GetChildType(list_type), initial_capacity)), capacity(initial_capacity) {
}